

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

Pool * __thiscall State::LookupPool(State *this,string *pool_name)

{
  iterator iVar1;
  Pool *pPVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
          ::find(&(this->pools_)._M_t,pool_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->pools_)._M_t._M_impl.super__Rb_tree_header) {
    pPVar2 = (Pool *)0x0;
  }
  else {
    pPVar2 = *(Pool **)(iVar1._M_node + 2);
  }
  return pPVar2;
}

Assistant:

Pool* State::LookupPool(const string& pool_name) {
  map<string, Pool*>::iterator i = pools_.find(pool_name);
  if (i == pools_.end())
    return NULL;
  return i->second;
}